

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O2

void celero::DoNotOptimizeAway<void>(function<void_()> *x)

{
  int iVar1;
  function<void_()> *p;
  
  std::function<void_()>::operator()(x);
  if (DoNotOptimizeAway<void>(std::function<void()>&&)::ttid == '\0') {
    iVar1 = __cxa_guard_acquire(&DoNotOptimizeAway<void>(std::function<void()>&&)::ttid);
    if (iVar1 != 0) {
      DoNotOptimizeAway<void>::ttid._M_thread = pthread_self();
      __cxa_guard_release(&DoNotOptimizeAway<void>(std::function<void()>&&)::ttid);
    }
  }
  if (DoNotOptimizeAway<void>::ttid._M_thread != 0) {
    return;
  }
  putchar((int)(char)*x);
  abort();
}

Assistant:

void celero::DoNotOptimizeAway(std::function<void(void)>&& x)
{
	x();

	// We must always do this test, but it will never pass.
	static auto ttid = std::this_thread::get_id();
	if(ttid == std::thread::id())
	{
		// This forces the value to never be optimized away
		// by taking a reference then using it.
		const auto* p = &x;
		putchar(*reinterpret_cast<const char*>(p));

		// If we do get here, kick out because something has gone wrong.
		std::abort();
	}
}